

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>_>
            *this,void *pointer)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  
  if (pointer != (void *)0x0) {
    plVar1 = *(long **)((long)pointer + 0x40);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x40) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    lVar2 = *(long *)((long)pointer + 0x20);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)pointer + 0x28);
      *(undefined8 *)((long)pointer + 0x20) = 0;
      *(undefined8 *)((long)pointer + 0x28) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x30))
                (*(undefined8 **)((long)pointer + 0x30),lVar2,1,uVar3,uVar3,0);
    }
    plVar1 = *(long **)((long)pointer + 0x18);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x48);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }